

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::TestMemswap<1000>(void)

{
  char cVar1;
  bool bVar2;
  undefined1 *puVar3;
  char *pcVar4;
  char *b_00;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  _func_void_char_ptr_char_ptr *odr_use_for_asm_dump;
  string expected_b;
  string expected_a;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  string b;
  string a;
  int local_10;
  anon_class_1_0_00000001 b_char;
  anon_class_1_0_00000001 a_char;
  ScopedTrace gtest_trace_321;
  
  local_10 = 1000;
  testing::ScopedTrace::ScopedTrace<int>
            ((ScopedTrace *)&a_char,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
             ,0x141,&local_10);
  std::__cxx11::string::string((string *)(b.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  for (local_5c = 0; local_5c < 1000; local_5c = local_5c + 1) {
    cVar1 = TestMemswap<1000>::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)(a.field_2._M_local_buf + 0xf),local_5c);
    std::__cxx11::string::operator+=((string *)(b.field_2._M_local_buf + 8),cVar1);
    cVar1 = TestMemswap<1000>::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)(a.field_2._M_local_buf + 0xe),local_5c);
    std::__cxx11::string::operator+=((string *)local_58,cVar1);
  }
  std::__cxx11::string::operator+=((string *)(b.field_2._M_local_buf + 8),'+');
  std::__cxx11::string::operator+=((string *)local_58,'-');
  std::__cxx11::string::string((string *)(expected_b.field_2._M_local_buf + 8),(string *)local_58);
  std::__cxx11::string::string
            ((string *)&odr_use_for_asm_dump,(string *)(b.field_2._M_local_buf + 8));
  puVar3 = (undefined1 *)std::__cxx11::string::back();
  *puVar3 = 0x2b;
  puVar3 = (undefined1 *)std::__cxx11::string::back();
  *puVar3 = 0x2d;
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)((long)&b.field_2 + 8));
  b_00 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
  internal::memswap<1000ul>(pcVar4,b_00);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )internal::memswap<1000ul>;
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_c8,"expected_a","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expected_b.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&b.field_2 + 8));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar2) {
    testing::Message::Message(&local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x159,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_e8,"expected_b","b",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &odr_use_for_asm_dump,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x15a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  std::__cxx11::string::~string((string *)&odr_use_for_asm_dump);
  std::__cxx11::string::~string((string *)(expected_b.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(b.field_2._M_local_buf + 8));
  testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&a_char);
  return;
}

Assistant:

void TestMemswap() {
  SCOPED_TRACE(kSize);

  const auto a_char = [](int i) -> char { return (i % ('z' - 'a')) + 'a'; };
  const auto b_char = [](int i) -> char { return (i % ('Z' - 'A')) + 'A'; };
  std::string a, b;
  for (int i = 0; i < kSize; ++i) {
    a += a_char(i);
    b += b_char(i);
  }
  // We will not swap these.
  a += '+';
  b += '-';

  std::string expected_a = b, expected_b = a;
  expected_a.back() = '+';
  expected_b.back() = '-';

  internal::memswap<kSize>(&a[0], &b[0]);

  // ODR use the functions in a way that forces the linker to keep them. That
  // way we can see their generated code.
  volatile auto odr_use_for_asm_dump = &internal::memswap<kSize>;
  (void)odr_use_for_asm_dump;

  EXPECT_EQ(expected_a, a);
  EXPECT_EQ(expected_b, b);
}